

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intCheck.c
# Opt level: O0

void Inter_CheckStop(Inter_Check_t *p)

{
  Inter_Check_t *p_local;
  
  if (p != (Inter_Check_t *)0x0) {
    Vec_IntFree(p->vOrLits);
    Vec_IntFree(p->vAndLits);
    Vec_IntFree(p->vAssLits);
    Cnf_DataFree(p->pCnf);
    Aig_ManStop(p->pFrames);
    sat_solver_delete(p->pSat);
    if (p != (Inter_Check_t *)0x0) {
      free(p);
    }
  }
  return;
}

Assistant:

void Inter_CheckStop( Inter_Check_t * p )
{
    if ( p == NULL )
        return;
    Vec_IntFree( p->vOrLits );
    Vec_IntFree( p->vAndLits );
    Vec_IntFree( p->vAssLits );
    Cnf_DataFree( p->pCnf );
    Aig_ManStop( p->pFrames );
    sat_solver_delete( p->pSat );
    ABC_FREE( p );
}